

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O0

uc_err reg_write_sparc(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  uc_err local_44;
  uc_err ret;
  CPUSPARCState *env;
  int *setpc_local;
  size_t *size_local;
  void *value_local;
  uint regid_local;
  int mode_local;
  void *_env_local;
  
  local_44 = UC_ERR_ARG;
  if ((regid < 0x35) || (0x3c < regid)) {
    if ((regid < 0x4e) || (0x55 < regid)) {
      if ((regid < 0x46) || (0x4d < regid)) {
        if ((regid < 0x3d) || (0x44 < regid)) {
          if (regid == 0x58) {
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            local_44 = UC_ERR_OK;
            *(undefined4 *)((long)_env + 0x28) = *value;
            *(int *)((long)_env + 0x2c) = *value + 4;
            *setpc = 1;
          }
        }
        else {
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          local_44 = UC_ERR_OK;
          *(undefined4 *)(*(long *)((long)_env + 0x20) + (ulong)(regid - 0x2d) * 4) = *value;
        }
      }
      else {
        if (*size < 4) {
          return UC_ERR_OVERFLOW;
        }
        *size = 4;
        local_44 = UC_ERR_OK;
        *(undefined4 *)(*(long *)((long)_env + 0x20) + (ulong)(regid - 0x3e) * 4) = *value;
      }
    }
    else {
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      local_44 = UC_ERR_OK;
      *(undefined4 *)(*(long *)((long)_env + 0x20) + (ulong)(regid - 0x4e) * 4) = *value;
    }
  }
  else {
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    local_44 = UC_ERR_OK;
    *(undefined4 *)((long)_env + (ulong)(regid - 0x35) * 4) = *value;
  }
  return local_44;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                 size_t *size, int *setpc)
{
    CPUSPARCState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_SPARC_REG_G0 && regid <= UC_SPARC_REG_G7) {
        CHECK_REG_TYPE(uint32_t);
        env->gregs[regid - UC_SPARC_REG_G0] = *(uint32_t *)value;
    } else if (regid >= UC_SPARC_REG_O0 && regid <= UC_SPARC_REG_O7) {
        CHECK_REG_TYPE(uint32_t);
        env->regwptr[regid - UC_SPARC_REG_O0] = *(uint32_t *)value;
    } else if (regid >= UC_SPARC_REG_L0 && regid <= UC_SPARC_REG_L7) {
        CHECK_REG_TYPE(uint32_t);
        env->regwptr[8 + regid - UC_SPARC_REG_L0] = *(uint32_t *)value;
    } else if (regid >= UC_SPARC_REG_I0 && regid <= UC_SPARC_REG_I7) {
        CHECK_REG_TYPE(uint32_t);
        env->regwptr[16 + regid - UC_SPARC_REG_I0] = *(uint32_t *)value;
    } else {
        switch (regid) {
        default:
            break;
        case UC_SPARC_REG_PC:
            CHECK_REG_TYPE(uint32_t);
            env->pc = *(uint32_t *)value;
            env->npc = *(uint32_t *)value + 4;
            *setpc = 1;
            break;
        }
    }

    return ret;
}